

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_listener::asio_rpc_listener
          (asio_rpc_listener *this,asio_service_impl *_impl,io_service *io,ssl_context *ssl_ctx,
          ushort port,bool _enable_ssl,ptr<logger> *l)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  _func_int **in_RCX;
  _func_int **in_RDX;
  char *pcVar4;
  _func_int **in_RSI;
  rpc_listener *in_RDI;
  byte in_R9B;
  type_conflict in_stack_00000008;
  bool in_stack_0000000f;
  endpoint_type *in_stack_00000010;
  io_context *in_stack_00000018;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *in_stack_00000020;
  shared_ptr<nuraft::logger> *in_stack_ffffffffffffff18;
  shared_ptr<nuraft::logger> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffff30;
  string local_78 [52];
  int local_44;
  byte local_23;
  _func_int **local_20;
  _func_int **local_18;
  _func_int **local_10;
  
  local_23 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  rpc_listener::rpc_listener(in_RDI);
  std::enable_shared_from_this<nuraft::asio_rpc_listener>::enable_shared_from_this
            ((enable_shared_from_this<nuraft::asio_rpc_listener> *)0x294c36);
  in_RDI->_vptr_rpc_listener = (_func_int **)&PTR__asio_rpc_listener_006e1e90;
  in_RDI[3]._vptr_rpc_listener = local_10;
  in_RDI[4]._vptr_rpc_listener = local_18;
  in_RDI[5]._vptr_rpc_listener = local_20;
  std::mutex::mutex((mutex *)0x294c76);
  std::shared_ptr<nuraft::raft_server>::shared_ptr((shared_ptr<nuraft::raft_server> *)0x294c89);
  *(undefined1 *)&in_RDI[0xd]._vptr_rpc_listener = 0;
  local_44 = (int)asio::ip::tcp::v4();
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
            (in_stack_ffffffffffffff30,
             (tcp *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (port_type)((ulong)in_stack_ffffffffffffff20 >> 0x30));
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f,
             in_stack_00000008);
  std::
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  ::vector((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
            *)0x294d0a);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffff20,
             (__integral_type)in_stack_ffffffffffffff18);
  std::mutex::mutex((mutex *)0x294d31);
  *(byte *)&in_RDI[0x22]._vptr_rpc_listener = local_23 & 1;
  std::shared_ptr<nuraft::logger>::shared_ptr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x23));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x294d89);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x294db9);
      pcVar4 = "UNSECURED";
      if (((ulong)in_RDI[0x22]._vptr_rpc_listener & 1) != 0) {
        pcVar4 = "SSL ENABLED";
      }
      msg_if_given_abi_cxx11_((char *)local_78,"Raft ASIO listener initiated, %s",pcVar4);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"asio_rpc_listener",0x303,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

asio_rpc_listener( asio_service_impl* _impl,
                       asio::io_service& io,
                       ssl_context& ssl_ctx,
                       ushort port,
                       bool _enable_ssl,
                       ptr<logger>& l )
        : impl_(_impl)
        , io_svc_(io)
        , ssl_ctx_(ssl_ctx)
        , handler_()
        , stopped_(false)
        , acceptor_(io, asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port))
        , session_id_cnt_(1)
        , ssl_enabled_(_enable_ssl)
        , l_(l)
    {
        p_in("Raft ASIO listener initiated, %s",
             ssl_enabled_ ? "SSL ENABLED" : "UNSECURED");
    }